

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O3

void __thiscall
cappuccino::lru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)0>::
find_range_fill<std::unordered_map<unsigned_long,std::optional<std::__cxx11::string>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::optional<std::__cxx11::string>>>>>
          (lru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)0> *this,
          unordered_map<unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *key_optional_value_range,peek peek)

{
  _Hash_node_base *p_Var1;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_58;
  bool local_38;
  
  p_Var1 = (key_optional_value_range->_M_h)._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
      ::do_find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_58,
                (lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
                 *)this,(unsigned_long *)(p_Var1 + 1),peek);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(p_Var1 + 2),
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58);
      if (local_38 == true) {
        local_38 = false;
        if (local_58._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_58._M_value + 0x10)) {
          operator_delete((void *)local_58._M_value._M_dataplus._M_p,local_58._16_8_ + 1);
        }
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

auto find_range_fill(range_type& key_optional_value_range, peek peek = peek::no) -> void
    {
        std::lock_guard guard{m_lock};
        for (auto& [key, optional_value] : key_optional_value_range)
        {
            optional_value = do_find(key, peek);
        }
    }